

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# surf.cc
# Opt level: O1

void __thiscall features::Surf::process(Surf *this)

{
  pointer pKVar1;
  pointer pDVar2;
  pointer pOVar3;
  pointer pOVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  ostream *poVar5;
  pointer pOVar6;
  
  pKVar1 = (this->keypoints).
           super__Vector_base<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->keypoints).
      super__Vector_base<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_>.
      _M_impl.super__Vector_impl_data._M_finish != pKVar1) {
    (this->keypoints).
    super__Vector_base<features::Surf::Keypoint,_std::allocator<features::Surf::Keypoint>_>._M_impl.
    super__Vector_impl_data._M_finish = pKVar1;
  }
  pDVar2 = (this->descriptors).
           super__Vector_base<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->descriptors).
      super__Vector_base<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>.
      _M_impl.super__Vector_impl_data._M_finish != pDVar2) {
    (this->descriptors).
    super__Vector_base<features::Surf::Descriptor,_std::allocator<features::Surf::Descriptor>_>.
    _M_impl.super__Vector_impl_data._M_finish = pDVar2;
  }
  pOVar3 = (this->octaves).
           super__Vector_base<features::Surf::Octave,_std::allocator<features::Surf::Octave>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pOVar4 = (this->octaves).
           super__Vector_base<features::Surf::Octave,_std::allocator<features::Surf::Octave>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pOVar6 = pOVar3;
  if (pOVar4 != pOVar3) {
    do {
      std::
      vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
      ::~vector(&pOVar6->imgs);
      pOVar6 = pOVar6 + 1;
    } while (pOVar6 != pOVar4);
    (this->octaves).
    super__Vector_base<features::Surf::Octave,_std::allocator<features::Surf::Octave>_>._M_impl.
    super__Vector_impl_data._M_finish = pOVar3;
  }
  std::chrono::_V2::system_clock::now();
  std::chrono::_V2::system_clock::now();
  if ((this->options).verbose_output == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"SURF: Creating 4 octaves (0 to 4)...",0x24);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
  }
  std::chrono::_V2::system_clock::now();
  create_octaves(this);
  if ((this->options).debug_output == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"SURF: Creating octaves took ",0x1c);
    std::chrono::_V2::system_clock::now();
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ms.",4);
    std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  if ((this->options).debug_output == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"SURF: Detecting local extrema...",0x20);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
  }
  std::chrono::_V2::system_clock::now();
  extrema_detection(this);
  if ((this->options).debug_output == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"SURF: Extrema detection took ",0x1d);
    std::chrono::_V2::system_clock::now();
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ms.",4);
    std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  if ((this->options).debug_output == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"SURF: Localizing and filtering keypoints...",0x2b);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
  }
  std::chrono::_V2::system_clock::now();
  keypoint_localization_and_filtering(this);
  pOVar3 = (this->octaves).
           super__Vector_base<features::Surf::Octave,_std::allocator<features::Surf::Octave>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pOVar4 = (this->octaves).
           super__Vector_base<features::Surf::Octave,_std::allocator<features::Surf::Octave>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  pOVar6 = pOVar3;
  if (pOVar4 != pOVar3) {
    do {
      std::
      vector<std::shared_ptr<core::Image<float>_>,_std::allocator<std::shared_ptr<core::Image<float>_>_>_>
      ::~vector(&pOVar6->imgs);
      pOVar6 = pOVar6 + 1;
    } while (pOVar6 != pOVar4);
    (this->octaves).
    super__Vector_base<features::Surf::Octave,_std::allocator<features::Surf::Octave>_>._M_impl.
    super__Vector_impl_data._M_finish = pOVar3;
  }
  if ((this->options).debug_output == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"SURF: Localization and filtering took ",0x26);
    std::chrono::_V2::system_clock::now();
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," ms.",4);
    std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  if ((this->options).verbose_output == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"SURF: Generating keypoint descriptors...",0x28);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '@');
    std::ostream::put('@');
    std::ostream::flush();
  }
  std::chrono::_V2::system_clock::now();
  descriptor_assignment(this);
  if ((this->options).debug_output == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"SURF: Generated ",0x10);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," descriptors, took ",0x13);
    std::chrono::_V2::system_clock::now();
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"ms.",3);
    std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  if ((this->options).verbose_output == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"SURF: Generated ",0x10);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," descriptors from ",0x12);
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," keypoints,",0xb);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5," took ",6);
    std::chrono::_V2::system_clock::now();
    poVar5 = std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"ms.",3);
    std::ios::widen((char)poVar5->_vptr_basic_ostream[-3] + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
  }
  this_00 = (this->sat).super___shared_ptr<core::Image<long>,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->sat).super___shared_ptr<core::Image<long>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->sat).super___shared_ptr<core::Image<long>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (this_00 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    return;
  }
  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  return;
}

Assistant:

void
Surf::process (void)
{
    this->keypoints.clear();
    this->descriptors.clear();
    this->octaves.clear();

    util::WallTimer timer, total_timer;

    /* Compute Hessian response maps and find SS maxima (SURF 3.3). */
    if (this->options.verbose_output)
    {
        std::cout << "SURF: Creating 4 octaves (0 to 4)..." << std::endl;
    }
    timer.reset();
    this->create_octaves();
    if (this->options.debug_output)
    {
        std::cout << "SURF: Creating octaves took "
            << timer.get_elapsed() << " ms." << std::endl;
    }

    /* Detect local extrema in the SS of Hessian response maps. */
    if (this->options.debug_output)
    {
        std::cout << "SURF: Detecting local extrema..." << std::endl;
    }
    timer.reset();
    this->extrema_detection();
    if (this->options.debug_output)
    {
        std::cout << "SURF: Extrema detection took "
            << timer.get_elapsed() << " ms." << std::endl;
    }

    /* Sub-pixel keypoint localization and filtering of weak keypoints. */
    if (this->options.debug_output)
    {
        std::cout << "SURF: Localizing and filtering keypoints..." << std::endl;
    }
    timer.reset();
    this->keypoint_localization_and_filtering();
    this->octaves.clear();
    if (this->options.debug_output)
    {
        std::cout << "SURF: Localization and filtering took "
            << timer.get_elapsed() << " ms." << std::endl;
    }

    /* Compute the SURF descriptor for the keypoint location. */
    if (this->options.verbose_output)
    {
        std::cout << "SURF: Generating keypoint descriptors..." << std::endl;
    }
    timer.reset();
    this->descriptor_assignment();
    if (this->options.debug_output)
    {
        std::cout << "SURF: Generated " << this->descriptors.size()
            << " descriptors, took " << timer.get_elapsed() << "ms."
            << std::endl;
    }
    if (this->options.verbose_output)
    {
        std::cout << "SURF: Generated " << this->descriptors.size()
            << " descriptors from " << this->keypoints.size() << " keypoints,"
            << " took " << total_timer.get_elapsed() << "ms." << std::endl;
    }

    /* Cleanup. */
    this->sat.reset();
}